

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O2

bool __thiscall QMakeParser::readFile(QMakeParser *this,int id,ParseFlags flags,QString *contents)

{
  QMakeParserHandler *pQVar1;
  ReadResult RVar2;
  storage_type *psVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  RVar2 = QMakeVfs::readFile(this->m_vfs,id,contents,(QString *)&local_58);
  if (((RVar2 != ReadOk) && (pQVar1 = this->m_handler, pQVar1 != (QMakeParserHandler *)0x0)) &&
     (RVar2 != ReadNotFound ||
      ((uint)flags.super_QFlagsStorageHelper<QMakeParser::ParseFlag,_4>.
             super_QFlagsStorage<QMakeParser::ParseFlag>.i & 4) != 0)) {
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("Cannot read %1: %2",0x13);
    QVar4.m_data = psVar3;
    QVar4.m_size = (qsizetype)&local_88;
    QString::fromLatin1(QVar4);
    QMakeVfs::fileNameForId((QString *)&local_a0,this->m_vfs,id);
    QString::arg<QString,QString&>
              ((type *)&local_70,(QString *)&local_88,(QString *)&local_a0,(QString *)&local_58);
    local_b8.d = (Data *)0x0;
    local_b8.ptr = (char16_t *)0x0;
    local_b8.size = 0;
    (*(code *)**(undefined8 **)pQVar1)(pQVar1,0x300,&local_70,&local_b8,0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return RVar2 == ReadOk;
  }
  __stack_chk_fail();
}

Assistant:

bool QMakeParser::readFile(int id, ParseFlags flags, QString *contents)
{
    QString errStr;
    QMakeVfs::ReadResult result = m_vfs->readFile(id, contents, &errStr);
    if (result != QMakeVfs::ReadOk) {
        if (m_handler && ((flags & ParseReportMissing) || result != QMakeVfs::ReadNotFound))
            m_handler->message(QMakeParserHandler::ParserIoError,
                               fL1S("Cannot read %1: %2").arg(m_vfs->fileNameForId(id), errStr));
        return false;
    }
    return true;
}